

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

uint __thiscall
Js::InterpreterStackFrame::CallAsmJsLoopBody(InterpreterStackFrame *this,JavascriptMethod address)

{
  uint uVar1;
  Var pointer;
  
  pointer = (*address)(*(RecyclableObject **)(this + 0x80),
                       (CallInfo)*(RecyclableObject **)(this + 0x80),0x80000001,0,0,0,0,0x80000001,
                       this);
  uVar1 = ::Math::PointerCastToIntegral<unsigned_int>(pointer);
  return uVar1;
}

Assistant:

uint
        InterpreterStackFrame::CallAsmJsLoopBody(JavascriptMethod address)
    {
#ifdef _M_IX86
        void *savedEsp = NULL;
        __asm
        {
            // Save ESP
            mov savedEsp, esp
            // Add an extra 4-bytes to the stack since we'll be pushing 3 arguments
            push eax
        }
#endif

#if defined(_M_ARM32_OR_ARM64)
        // For ARM we need to make sure that pipeline is synchronized with memory/cache for newly jitted code.
        // Note: this does not seem to affect perf, but if it was, we could add a boolean isCalled to EntryPointInfo
        //       and do ISB only for 1st time this entry point is called (potential working set regression though).
        #if defined(_InstructionSynchronizationBarrier)
        _InstructionSynchronizationBarrier();
        #else
        asm("isb");
        #endif
#endif
        uint newOffset = ::Math::PointerCastToIntegral<uint>(
            CALL_ENTRYPOINT_NOASSERT(address, function, CallInfo(CallFlags_InternalFrame, 1), this));

#ifdef _M_IX86
        _asm
        {
            // Restore ESP
            mov esp, savedEsp
        }
#endif
        return newOffset;
    }